

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestHugeFieldNumbersLite::Clear(TestHugeFieldNumbersLite *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_58;
  Voidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  TestHugeFieldNumbersLite *pTStack_18;
  uint32_t cached_has_bits;
  TestHugeFieldNumbersLite *this_local;
  
  this_local = (TestHugeFieldNumbersLite *)&this->field_0;
  local_1c = 0;
  pTStack_18 = this;
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_int32_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_int32_);
  google::protobuf::internal::
  MapFieldLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.string_string_map_);
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 0xf) != 0) {
    if ((local_1c & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_string_);
    }
    if ((local_1c & 2) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_bytes_);
    }
    if ((local_1c & 4) != 0) {
      local_31 = 0;
      if ((this->field_0)._impl_.optional_message_ == (ForeignMessageLite *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x29e7,"_impl_.optional_message_ != nullptr");
        local_31 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
      }
      if ((local_31 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      ForeignMessageLite::Clear((this->field_0)._impl_.optional_message_);
    }
    if ((local_1c & 8) != 0) {
      if ((this->field_0)._impl_.optionalgroup_ == (TestHugeFieldNumbersLite_OptionalGroup *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x29eb,"_impl_.optionalgroup_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_58);
      }
      TestHugeFieldNumbersLite_OptionalGroup::Clear((this->field_0)._impl_.optionalgroup_);
    }
  }
  if ((local_1c & 0x70) != 0) {
    memset((void *)((long)&this->field_0 + 0x88),0,8);
    (this->field_0)._impl_.optional_enum_ = 4;
  }
  clear_oneof_field(this);
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestHugeFieldNumbersLite::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestHugeFieldNumbersLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.repeated_int32_.Clear();
  _impl_.packed_int32_.Clear();
  _impl_.string_string_map_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.optional_string_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.optional_bytes_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.optional_message_ != nullptr);
      _impl_.optional_message_->Clear();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.optionalgroup_ != nullptr);
      _impl_.optionalgroup_->Clear();
    }
  }
  if ((cached_has_bits & 0x00000070u) != 0) {
    ::memset(&_impl_.optional_int32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.fixed_32_) -
        reinterpret_cast<char*>(&_impl_.optional_int32_)) + sizeof(_impl_.fixed_32_));
    _impl_.optional_enum_ = 4;
  }
  clear_oneof_field();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}